

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gillespie.cpp
# Opt level: O3

void __thiscall Gillespie::Initialize(Gillespie *this)

{
  pointer psVar1;
  runtime_error *this_00;
  ulong uVar2;
  long lVar3;
  Ptr local_38;
  
  if (this->initialized_ == false) {
    psVar1 = (this->reactions_).
             super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->reactions_).
        super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>.
        _M_impl.super__Vector_impl_data._M_finish != psVar1) {
      lVar3 = 8;
      uVar2 = 0;
      do {
        local_38.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)((long)psVar1 + lVar3 + -8);
        local_38.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&(psVar1->super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
              lVar3);
        if (local_38.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_38.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_38.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_38.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_38.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        UpdatePropensity(this,&local_38);
        if (local_38.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_38.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        uVar2 = uVar2 + 1;
        psVar1 = (this->reactions_).
                 super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar3 = lVar3 + 0x10;
      } while (uVar2 < (ulong)((long)(this->reactions_).
                                     super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4)
              );
    }
    this->initialized_ = true;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"Gillespie: Reaction propensities have already been initialized.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Gillespie::Initialize() {
  // Check that propensities have not already been initialized.
  if (initialized_ == true) {
    throw std::runtime_error(
        "Gillespie: Reaction propensities have already been initialized.");
  }
  // Update all propensities
  for (int i = 0; i < reactions_.size(); i++) {
    UpdatePropensity(reactions_[i]);
  }
  // Make sure prop sum is starting from 0, sum over all propensities.
  // alpha_sum_ = 0;
  // for (const auto &alpha : alpha_list_) {
  //  alpha_sum_ += alpha;
  // }
  initialized_ = true;
}